

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ecf33::DirectoryStructureInputNodeTask::start
          (DirectoryStructureInputNodeTask *this,TaskInterface ti)

{
  undefined1 this_00 [8];
  unsigned_long *puVar1;
  StringList *pSVar2;
  char *pcVar3;
  StringList *in_R8;
  bool bVar4;
  StringRef path_00;
  bool local_229;
  BuildKey local_200;
  KeyType local_1e0;
  char *local_1c0;
  unsigned_long local_1b8;
  char *local_1b0 [2];
  char *local_1a0;
  char *local_198;
  char *local_190 [2];
  undefined1 local_180 [8];
  StringRef path;
  DirectoryStructureInputNodeTask *this_local;
  TaskInterface ti_local;
  char *local_f0;
  char *local_e8;
  char **local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  int local_ac;
  char *local_a8;
  char **local_a0;
  char *local_98;
  char **local_90;
  StringRef *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  iterator local_60;
  int local_54;
  unsigned_long local_50;
  char *local_48;
  unsigned_long local_40;
  undefined1 *local_38;
  undefined1 local_30 [16];
  unsigned_long local_20;
  char *local_18;
  undefined1 *local_10;
  
  ti_local.impl = ti.ctx;
  this_local = (DirectoryStructureInputNodeTask *)ti.impl;
  path.Length = (size_t)this;
  _local_180 = llbuild::buildsystem::Node::getName(&this->node->super_Node);
  local_a0 = local_190;
  local_a8 = "/";
  local_190[0] = "/";
  local_78 = (char *)strlen("/");
  local_80 = local_190[0];
  local_88 = (StringRef *)local_180;
  local_229 = false;
  if (local_78 <= path.Data) {
    local_60 = llvm::StringRef::end(local_88);
    local_60 = local_60 + -(long)local_78;
    local_68 = local_80;
    local_70 = local_78;
    if (local_78 == (char *)0x0) {
      local_54 = 0;
    }
    else {
      local_54 = memcmp(local_60,local_80,(size_t)local_78);
    }
    local_229 = local_54 == 0;
  }
  bVar4 = false;
  if (local_229) {
    local_1a0 = (char *)local_180;
    local_198 = path.Data;
    local_90 = local_1b0;
    local_98 = "/";
    local_1b0[0] = "/";
    local_d0 = (char *)strlen("/");
    local_f0 = local_1a0;
    local_e8 = local_198;
    local_d8 = local_1b0[0];
    local_e0 = &local_f0;
    bVar4 = false;
    if (local_198 == local_d0) {
      local_b8 = local_1a0;
      local_c0 = local_1b0[0];
      local_c8 = local_d0;
      if (local_d0 == (char *)0x0) {
        local_ac = 0;
      }
      else {
        local_ac = memcmp(local_1a0,local_1b0[0],(size_t)local_d0);
      }
      bVar4 = local_ac == 0;
    }
    bVar4 = (bool)(bVar4 ^ 1);
  }
  if (bVar4) {
    ti_local.ctx = local_180;
    local_48 = path.Data + -1;
    local_40 = 0;
    local_38 = (undefined1 *)ti_local.ctx;
    puVar1 = std::min<unsigned_long>(&local_40,(unsigned_long *)&path);
    local_40 = *puVar1;
    pcVar3 = (char *)((long)local_180 + local_40);
    local_50 = (long)path.Data - local_40;
    puVar1 = std::min<unsigned_long>((unsigned_long *)&local_48,&local_50);
    local_1b8 = *puVar1;
    local_10 = local_30;
    path.Data = (char *)local_1b8;
    local_180 = (undefined1  [8])pcVar3;
    local_1c0 = pcVar3;
    local_20 = local_1b8;
    local_18 = pcVar3;
  }
  this_00 = local_180;
  pcVar3 = path.Data;
  pSVar2 = llbuild::buildsystem::BuildNode::contentExclusionPatterns(this->node);
  path_00.Length = (size_t)pSVar2;
  path_00.Data = pcVar3;
  llbuild::buildsystem::BuildKey::makeDirectoryTreeStructureSignature
            (&local_200,(BuildKey *)this_00,path_00,in_R8);
  llbuild::buildsystem::BuildKey::toData(&local_1e0,&local_200);
  llbuild::core::TaskInterface::request((TaskInterface *)&this_local,&local_1e0,0);
  llbuild::core::KeyType::~KeyType(&local_1e0);
  llbuild::buildsystem::BuildKey::~BuildKey(&local_200);
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Remove any trailing slash from the node name.
    StringRef path =  node.getName();
    if (path.endswith("/") && path != "/") {
      path = path.substr(0, path.size() - 1);
    }
    ti.request(BuildKey::makeDirectoryTreeStructureSignature(path,
                 node.contentExclusionPatterns()).toData(),
               /*inputID=*/0);
  }